

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O1

BasicBlock * anon_unknown.dwarf_23d32::chooseTarget(BasicBlock *Avoid)

{
  SymbolTableList<llvm::BasicBlock> *pSVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  BasicBlock *pBVar6;
  undefined1 *puVar7;
  ilist_node_base<false> **ppiVar8;
  long lVar9;
  Twine local_80;
  void *pvStack_58;
  vector<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
  targets;
  undefined1 auStack_38 [8];
  inst_iterator i;
  
  pvStack_58 = (void *)0x0;
  targets.
  super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  targets.
  super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar1 = (SymbolTableList<llvm::BasicBlock> *)((anonymous_namespace)::F + 0x48);
  i.BBs = *(SymbolTableList<llvm::BasicBlock> **)((anonymous_namespace)::F + 0x50);
  i.BB.NodePtr = (node_pointer)0x0;
  if (i.BBs != pSVar1) {
    puVar7 = &i.BBs[-2].field_0x8;
    if (i.BBs == (SymbolTableList<llvm::BasicBlock> *)0x0) {
      puVar7 = (undefined1 *)0x0;
    }
    i.BB.NodePtr = *(node_pointer *)(puVar7 + 0x30);
    if (i.BB.NodePtr == (node_pointer)(puVar7 + 0x28)) {
      do {
        i.BBs = *(SymbolTableList<llvm::BasicBlock> **)&(i.BBs)->field_0x8;
        if (i.BBs == pSVar1) break;
        puVar7 = &i.BBs[-2].field_0x8;
        if (i.BBs == (SymbolTableList<llvm::BasicBlock> *)0x0) {
          puVar7 = (undefined1 *)0x0;
        }
        i.BB.NodePtr = *(node_pointer *)(puVar7 + 0x30);
      } while (i.BB.NodePtr == (node_pointer)(puVar7 + 0x28));
    }
  }
  i.BB.NodePtr = (node_pointer)((i.BB.NodePtr)->super_node_base_type).Next;
  puVar7 = &i.BBs[-2].field_0x8;
  if (i.BBs == (SymbolTableList<llvm::BasicBlock> *)0x0) {
    puVar7 = (undefined1 *)0x0;
  }
  if ((ilist_node_base<false> *)i.BB.NodePtr == (ilist_node_base<false> *)(puVar7 + 0x28)) {
    do {
      i.BBs = *(SymbolTableList<llvm::BasicBlock> **)&(i.BBs)->field_0x8;
      if (i.BBs == pSVar1) break;
      puVar7 = &i.BBs[-2].field_0x8;
      if (i.BBs == (SymbolTableList<llvm::BasicBlock> *)0x0) {
        puVar7 = (undefined1 *)0x0;
      }
      i.BB.NodePtr = *(node_pointer *)(puVar7 + 0x30);
    } while (i.BB.NodePtr == (node_pointer)(puVar7 + 0x28));
  }
  auStack_38 = (undefined1  [8])pSVar1;
  do {
    do {
      if ((i.BBs == pSVar1) &&
         (((undefined1  [8])i.BBs == auStack_38 || (i.BB.NodePtr == (node_pointer)0x0)))) {
        iVar4 = Choose((int)((ulong)((long)targets.
                                           super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start -
                                    (long)pvStack_58) >> 3) * -0x55555555);
        lVar2 = *(long *)((long)pvStack_58 + (long)iVar4 * 0x18 + 0x10);
        lVar9 = lVar2 + -0x18;
        if (lVar2 == 0) {
          lVar9 = 0;
        }
        lVar5 = llvm::BasicBlock::getFirstInsertionPt(*(BasicBlock **)(lVar9 + 0x28));
        bVar3 = lVar2 == 0;
        if (lVar5 != 0) {
          bVar3 = lVar5 + -0x18 == lVar9;
        }
        pBVar6 = *(BasicBlock **)(lVar9 + 0x28);
        if (!bVar3) {
          llvm::Twine::Twine(&local_80,"spl");
          pBVar6 = (BasicBlock *)llvm::BasicBlock::splitBasicBlock(pBVar6,lVar9 + 0x18,&local_80,0);
        }
        if (pvStack_58 != (void *)0x0) {
          operator_delete(pvStack_58,
                          (long)targets.
                                super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvStack_58);
        }
        return pBVar6;
      }
      ppiVar8 = &i.BB.NodePtr[-2].super_node_base_type.Next;
      if (i.BB.NodePtr == (node_pointer)0x0) {
        ppiVar8 = (ilist_node_base<false> **)0x0;
      }
      if (10 < *(byte *)(ppiVar8 + 2) - 0x1c) {
        if (targets.
            super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            targets.
            super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,false,false,void>,false,false>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,false,false,void>,false,false>,llvm::Instruction>,std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,false,false,void>,false,false>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,false,false,void>,false,false>,llvm::Instruction>>>
          ::
          _M_realloc_insert<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,false,false,void>,false,false>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,false,false,void>,false,false>,llvm::Instruction>const&>
                    ((vector<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,false,false,void>,false,false>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,false,false,void>,false,false>,llvm::Instruction>,std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,false,false,void>,false,false>,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,false,false,void>,false,false>,llvm::Instruction>>>
                      *)&pvStack_58,
                     (iterator)
                     targets.
                     super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                      *)auStack_38);
        }
        else {
          ((targets.
            super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->BI).NodePtr = (node_pointer)i.BB.NodePtr;
          (targets.
           super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->BBs =
               (SymbolTableList<llvm::BasicBlock> *)auStack_38;
          ((targets.
            super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->BB).NodePtr = (node_pointer)i.BBs;
          targets.
          super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               targets.
               super__Vector_base<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>,_std::allocator<llvm::InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      i.BB.NodePtr = (node_pointer)((i.BB.NodePtr)->super_node_base_type).Next;
      puVar7 = &i.BBs[-2].field_0x8;
      if (i.BBs == (SymbolTableList<llvm::BasicBlock> *)0x0) {
        puVar7 = (undefined1 *)0x0;
      }
    } while ((ilist_node_base<false> *)i.BB.NodePtr != (ilist_node_base<false> *)(puVar7 + 0x28));
    do {
      i.BBs = *(SymbolTableList<llvm::BasicBlock> **)&(i.BBs)->field_0x8;
      if ((undefined1  [8])i.BBs == auStack_38) break;
      puVar7 = &i.BBs[-2].field_0x8;
      if (i.BBs == (SymbolTableList<llvm::BasicBlock> *)0x0) {
        puVar7 = (undefined1 *)0x0;
      }
      i.BB.NodePtr = *(node_pointer *)(puVar7 + 0x30);
    } while (i.BB.NodePtr == (node_pointer)(puVar7 + 0x28));
  } while( true );
}

Assistant:

BasicBlock *chooseTarget(BasicBlock *Avoid = 0) {
  std::vector<inst_iterator> targets;
  auto i = inst_begin(F), ie = inst_end(F);
  ++i;
  for (; i != ie; ++i)
    if (!i->isTerminator())
      targets.push_back(i);
  auto t = targets[Choose(targets.size())];
  Instruction *I = &*t;
  BasicBlock *BB;
  if (I == &*I->getParent()->getFirstInsertionPt()) {
    BB = I->getParent();
  } else {
    BB = I->getParent()->splitBasicBlock(I, "spl");
  }
  return BB;
}